

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O0

Ref<embree::XML> embree::parseXML(FileName *fileName,string *id,bool hasHeader)

{
  long *plVar1;
  byte in_CL;
  string *in_RDX;
  XML *in_RDI;
  FileStream *unaff_retaddr;
  undefined1 in_stack_000002c6;
  undefined1 in_stack_000002c7;
  string *in_stack_000002c8;
  Ref<embree::Stream<int>_> *in_stack_000002d0;
  string local_78 [48];
  long *local_48;
  byte local_39;
  long *local_20;
  long **local_18;
  long **local_10;
  FileName *in_stack_fffffffffffffff8;
  
  local_39 = in_CL & 1;
  plVar1 = (long *)::operator_new(0x270);
  FileStream::FileStream(unaff_retaddr,in_stack_fffffffffffffff8);
  local_18 = &local_48;
  local_20 = plVar1;
  local_48 = plVar1;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  std::__cxx11::string::string(local_78,in_RDX);
  parseXML(in_stack_000002d0,in_stack_000002c8,(bool)in_stack_000002c7,(bool)in_stack_000002c6);
  std::__cxx11::string::~string(local_78);
  local_10 = &local_48;
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 0x18))();
  }
  return (Ref<embree::XML>)in_RDI;
}

Assistant:

Ref<XML> parseXML(const FileName& fileName, std::string id, bool hasHeader) {
    return parseXML(new FileStream(fileName),id,hasHeader,false);
  }